

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O3

void Dch_ManStop(Dch_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  
  Aig_ManFanoutStop(p->pAigTotal);
  if (p->pPars->fVerbose != 0) {
    Dch_ManPrintStats(p);
  }
  if (p->pAigFraig != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pAigFraig);
  }
  if (p->ppClasses != (Dch_Cla_t *)0x0) {
    Dch_ClassesStop(p->ppClasses);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  pVVar1 = p->vUsedNodes;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vFanins;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vSimRoots;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vSimClasses;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  if (p->pReprsProved != (Aig_Obj_t **)0x0) {
    free(p->pReprsProved);
    p->pReprsProved = (Aig_Obj_t **)0x0;
  }
  if (p->pSatVars != (int *)0x0) {
    free(p->pSatVars);
  }
  free(p);
  return;
}

Assistant:

void Dch_ManStop( Dch_Man_t * p )
{
    Aig_ManFanoutStop( p->pAigTotal );
    if ( p->pPars->fVerbose )
        Dch_ManPrintStats( p );
    if ( p->pAigFraig )
        Aig_ManStop( p->pAigFraig );
    if ( p->ppClasses )
        Dch_ClassesStop( p->ppClasses );
    if ( p->pSat )
        sat_solver_delete( p->pSat );
    Vec_PtrFree( p->vUsedNodes );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vSimRoots );
    Vec_PtrFree( p->vSimClasses );
    ABC_FREE( p->pReprsProved );
    ABC_FREE( p->pSatVars );
    ABC_FREE( p );
}